

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

OASIS_FLOAT __thiscall
aggreports::GetLoss(aggreports *this,double next_return_period,double last_return_period,
                   OASIS_FLOAT last_loss,double current_return_period,OASIS_FLOAT current_loss)

{
  line_points lp;
  double dVar1;
  double zz;
  line_points lpt;
  OASIS_FLOAT current_loss_local;
  double current_return_period_local;
  OASIS_FLOAT last_loss_local;
  double last_return_period_local;
  double next_return_period_local;
  aggreports *this_local;
  
  if ((current_return_period != 0.0) || (NAN(current_return_period))) {
    if ((current_loss != 0.0) || (NAN(current_loss))) {
      if ((current_return_period != next_return_period) ||
         (this_local._4_4_ = current_loss, NAN(current_return_period) || NAN(next_return_period))) {
        if (next_return_period <= current_return_period) {
          this_local._4_4_ = -1.0;
        }
        else {
          lp.from_y = (double)last_loss;
          lp.from_x = last_return_period;
          lp.to_x = current_return_period;
          lp.to_y = (double)current_loss;
          dVar1 = linear_interpolate(lp,next_return_period);
          this_local._4_4_ = (OASIS_FLOAT)dVar1;
        }
      }
    }
    else {
      this_local._4_4_ = 0.0;
    }
  }
  else {
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

OASIS_FLOAT aggreports::GetLoss(const double next_return_period,
				const double last_return_period,
				const OASIS_FLOAT last_loss,
				const double current_return_period,
				const OASIS_FLOAT current_loss) const {

  if (current_return_period == 0.0) return 0.0;

  if (current_loss == 0.0) return 0.0;

  if (current_return_period == next_return_period) return current_loss;

  if (current_return_period < next_return_period) {
    line_points lpt;
    lpt.from_x = last_return_period;
    lpt.from_y = last_loss;
    lpt.to_x = current_return_period;
    lpt.to_y = current_loss;
    double zz = linear_interpolate(lpt, next_return_period);
    return zz;
  }

  return -1;   // should not get here

}